

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_type.hxx
# Opt level: O0

string * nuraft::msg_type_to_string_abi_cxx11_(msg_type type)

{
  undefined4 in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  allocator *paVar1;
  undefined8 in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  string local_58 [32];
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"request_vote_request",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"request_vote_response",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"append_entries_request",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"append_entries_response",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"client_request",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"add_server_request",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"add_server_response",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"remove_server_request",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"remove_server_response",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"sync_log_request",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"sync_log_response",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"join_cluster_request",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"join_cluster_response",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"leave_cluster_request",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"leave_cluster_response",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"install_snapshot_request",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"install_snapshot_response",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"ping_request",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"ping_response",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"pre_vote_request",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0x15:
    paVar1 = &local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"pre_vote_response",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0x16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"other_request",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 0x17:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"other_response",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0x18:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"priority_change_request",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"priority_change_response",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 0x1a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"reconnect_request",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x1b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"reconnect_response",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0x1c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"custom_notification_request",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case 0x1d:
    paVar1 = &local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"custom_notification_response",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  default:
    __rhs = local_78;
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffe88,__rhs);
    std::operator+(in_stack_fffffffffffffe88,(char *)__rhs);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)local_78);
  }
  return in_RDI;
}

Assistant:

inline std::string ATTR_UNUSED msg_type_to_string(msg_type type) {
    switch (type) {
    case request_vote_request:          return "request_vote_request";
    case request_vote_response:         return "request_vote_response";
    case append_entries_request:        return "append_entries_request";
    case append_entries_response:       return "append_entries_response";
    case client_request:                return "client_request";
    case add_server_request:            return "add_server_request";
    case add_server_response:           return "add_server_response";
    case remove_server_request:         return "remove_server_request";
    case remove_server_response:        return "remove_server_response";
    case sync_log_request:              return "sync_log_request";
    case sync_log_response:             return "sync_log_response";
    case join_cluster_request:          return "join_cluster_request";
    case join_cluster_response:         return "join_cluster_response";
    case leave_cluster_request:         return "leave_cluster_request";
    case leave_cluster_response:        return "leave_cluster_response";
    case install_snapshot_request:      return "install_snapshot_request";
    case install_snapshot_response:     return "install_snapshot_response";
    case ping_request:                  return "ping_request";
    case ping_response:                 return "ping_response";
    case pre_vote_request:              return "pre_vote_request";
    case pre_vote_response:             return "pre_vote_response";
    case other_request:                 return "other_request";
    case other_response:                return "other_response";
    case priority_change_request:       return "priority_change_request";
    case priority_change_response:      return "priority_change_response";
    case reconnect_request:             return "reconnect_request";
    case reconnect_response:            return "reconnect_response";
    case custom_notification_request:   return "custom_notification_request";
    case custom_notification_response:  return "custom_notification_response";
    default:
        return "unknown (" + std::to_string(static_cast<int>(type)) + ")";
    }
}